

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FastaParser.h
# Opt level: O3

unordered_set<std::string> *
parseFasta(unordered_set<std::string> *__return_storage_ptr__,string *fileName)

{
  char cVar1;
  istream *piVar2;
  ostream *poVar3;
  runtime_error *this;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  string seq_id;
  string line;
  string DNA_sequence;
  ifstream input;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  undefined1 local_258 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_238 [2];
  int aiStack_218 [122];
  
  __return_storage_ptr__->mHashMultiplier = 0xc4ceb9fe1a85ec53;
  __return_storage_ptr__->mKeyVals = (Node *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mInfo = (uint8_t *)&__return_storage_ptr__->mMask;
  __return_storage_ptr__->mNumElements = 0;
  __return_storage_ptr__->mMask = 0;
  __return_storage_ptr__->mMaxNumElementsAllowed = 0;
  __return_storage_ptr__->mInfoInc = 0x20;
  __return_storage_ptr__->mInfoHashShift = 0;
  std::ifstream::ifstream(local_238,(string *)fileName,_S_in);
  if (*(int *)((long)aiStack_218 + *(long *)(local_238[0]._M_allocated_capacity - 0x18)) != 0) {
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"[!] ",4);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error opening: ",0xf);
    poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                       ((ostream *)&std::cerr,(fileName->_M_dataplus)._M_p,
                        fileName->_M_string_length);
    std::__ostream_insert<char,std::char_traits<char>>(poVar3,". ",2);
    std::endl<char,std::char_traits<char>>(poVar3);
    this = (runtime_error *)__cxa_allocate_exception(0x10);
    std::operator+(&local_2b8,"Error opening: ",fileName);
    pbVar4 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::append
                       (&local_2b8," .");
    paVar5 = &pbVar4->field_2;
    local_298._M_dataplus._M_p = (pbVar4->_M_dataplus)._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298._M_dataplus._M_p == paVar5) {
      local_298.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
      local_298.field_2._8_8_ = *(undefined8 *)((long)&pbVar4->field_2 + 8);
      local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
    }
    else {
      local_298.field_2._M_allocated_capacity = paVar5->_M_allocated_capacity;
    }
    local_298._M_string_length = pbVar4->_M_string_length;
    (pbVar4->_M_dataplus)._M_p = (pointer)paVar5;
    pbVar4->_M_string_length = 0;
    (pbVar4->field_2)._M_local_buf[0] = '\0';
    std::runtime_error::runtime_error(this,(string *)&local_298);
    __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
  }
  local_298._M_dataplus._M_p = (pointer)&local_298.field_2;
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  local_298._M_string_length = 0;
  local_2b8._M_string_length = 0;
  local_278._M_string_length = 0;
  local_298.field_2._M_allocated_capacity =
       local_298.field_2._M_allocated_capacity & 0xffffffffffffff00;
  local_2b8.field_2._M_local_buf[0] = '\0';
  local_278.field_2._M_local_buf[0] = '\0';
  local_278._M_dataplus._M_p = (pointer)&local_278.field_2;
  while( true ) {
    cVar1 = std::ios::widen((char)*(undefined8 *)(local_238[0]._M_allocated_capacity - 0x18) +
                            (char)local_238);
    piVar2 = std::getline<char,std::char_traits<char>,std::allocator<char>>
                       ((istream *)local_238[0]._M_local_buf,(string *)&local_298,cVar1);
    if (((byte)piVar2[*(long *)(*(long *)piVar2 + -0x18) + 0x20] & 5) != 0) break;
    if ((local_298._M_string_length != 0) && (*local_298._M_dataplus._M_p != ';')) {
      if (*local_298._M_dataplus._M_p == '>') {
        if (local_2b8._M_string_length != 0) {
          robin_hood::detail::
          Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
          ::emplace<std::__cxx11::string_const&>
                    ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
                      *)local_258,
                     (Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                      *)__return_storage_ptr__,&local_278);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::substr
                  ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258,
                   &local_298,1,0xffffffffffffffff);
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::operator=
                  (&local_2b8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_258);
        if ((NodePtr)local_258._0_8_ != (NodePtr)(local_258 + 0x10)) {
          operator_delete((void *)local_258._0_8_,local_258._16_8_ + 1);
        }
        local_278._M_string_length = 0;
        *local_278._M_dataplus._M_p = '\0';
      }
      else {
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::_M_append
                  (&local_278,local_298._M_dataplus._M_p,local_298._M_string_length);
      }
    }
  }
  if (local_2b8._M_string_length != 0) {
    robin_hood::detail::
    Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
    ::emplace<std::__cxx11::string_const&>
              ((pair<robin_hood::detail::Table<true,_80UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void,_robin_hood::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>::Iter<false>,_bool>
                *)local_258,
               (Table<true,80ul,std::__cxx11::string,void,robin_hood::hash<std::__cxx11::string,void>,std::equal_to<std::__cxx11::string>>
                *)__return_storage_ptr__,&local_278);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_278._M_dataplus._M_p != &local_278.field_2) {
    operator_delete(local_278._M_dataplus._M_p,
                    CONCAT71(local_278.field_2._M_allocated_capacity._1_7_,
                             local_278.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p,
                    CONCAT71(local_2b8.field_2._M_allocated_capacity._1_7_,
                             local_2b8.field_2._M_local_buf[0]) + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_298._M_dataplus._M_p != &local_298.field_2) {
    operator_delete(local_298._M_dataplus._M_p,local_298.field_2._M_allocated_capacity + 1);
  }
  std::ifstream::~ifstream(local_238);
  return __return_storage_ptr__;
}

Assistant:

robin_hood::unordered_set<std::string> parseFasta(const std::string &fileName) {
    /*
     * Parses a fasta file and returns a set of all sequences.
     */
    robin_hood::unordered_set<std::string> sequences = robin_hood::unordered_set<std::string>();
    std::ifstream input(fileName);
    if (!input.good()) {
        ERROR("Error opening: " << fileName << ". ");
        throw std::runtime_error("Error opening: " + fileName + " .");
    }
    std::string line, seq_id, DNA_sequence;

    while (std::getline(input, line)) {
        // line may be empty so you *must* ignore blank lines
        // or you have a crash waiting to happen with line[0]
        if (line.empty())
            continue;

        if (line[0] == '>') {
            // output previous line before overwriting seq_id
            // but ONLY if seq_id actually contains something
            if (!seq_id.empty())
                sequences.insert(DNA_sequence);
            seq_id = line.substr(1);
            DNA_sequence.clear();
        } else if (line[0] == ';') {
            //skip comment lines
            continue;
        } else {
            DNA_sequence += line;
        }
    }

    // output final entry ONLY if seq_id actually contains something
    if (!seq_id.empty())
        sequences.insert(DNA_sequence);
    return sequences;
}